

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O0

int anon_unknown.dwarf_364d1::xOpen
              (sqlite3_vfs *svfs,sqlite3_filename zName,sqlite3_file *sfile,int flags,int *pOutFlags
              )

{
  char16_t *pcVar1;
  ulong uVar2;
  uint in_ECX;
  QString *in_RDX;
  long in_RSI;
  QtFile *in_RDI;
  uint *in_R8;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  File *file;
  Vfs *vfs;
  OpenMode mode;
  OpenModeFlag in_stack_ffffffffffffff7c;
  QFlags<QIODeviceBase::OpenModeFlag> *in_stack_ffffffffffffff80;
  int local_48;
  storage_type_conflict *local_40;
  undefined1 local_30 [28];
  QFlagsStorage<QIODeviceBase::OpenModeFlag> local_14;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RSI;
  memset(in_RDX,0,0x10);
  local_14.i = 0xaaaaaaaa;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  if ((local_10 == 0) || ((in_ECX & 0x80) != 0)) {
    local_48 = 3;
  }
  else {
    if (((((in_ECX & 1) == 0) || ((in_ECX & 2) != 0)) || ((in_ECX & 4) != 0)) || ((in_ECX & 8) != 0)
       ) {
      if (((in_ECX & 4) != 0) && ((in_ECX & 0x10) != 0)) {
        QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_14,NewOnly);
      }
      if ((in_ECX & 2) != 0) {
        QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                  ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_14,ReadWrite);
      }
    }
    else {
      QFlags<QIODeviceBase::OpenModeFlag>::operator|=
                ((QFlags<QIODeviceBase::OpenModeFlag> *)&local_14,ReadOnly);
    }
    (in_RDX->d).d = (Data *)&in_RDI[7].field_0x8;
    pcVar1 = (char16_t *)operator_new(0x18);
    QByteArrayView::QByteArrayView<const_char_*,_true>((QByteArrayView *)in_RDI,(char **)in_RDX);
    QVar3.m_data = local_40;
    QVar3.m_size = (qsizetype)local_30;
    QString::fromUtf8(QVar3);
    File::QtFile::QtFile(in_RDI,in_RDX,SUB81((ulong)pcVar1 >> 0x38,0));
    (in_RDX->d).ptr = pcVar1;
    QString::~QString((QString *)0x130977);
    pcVar1 = (in_RDX->d).ptr;
    uVar2 = (**(code **)(*(long *)pcVar1 + 0x68))(pcVar1,local_14.i);
    if ((uVar2 & 1) == 0) {
      local_48 = 0xe;
    }
    else {
      if (in_R8 != (uint *)0x0) {
        *in_R8 = in_ECX;
      }
      local_48 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_48;
}

Assistant:

int xOpen(sqlite3_vfs *svfs, sqlite3_filename zName, sqlite3_file *sfile,
          int flags, int *pOutFlags)
{
    auto vfs = static_cast<Vfs *>(svfs);
    auto file = static_cast<File *>(sfile);
    memset(file, 0, sizeof(File));
    QIODeviceBase::OpenMode mode = QIODeviceBase::NotOpen;
    if (!zName || (flags & SQLITE_OPEN_MEMORY))
        return SQLITE_PERM;
    if ((flags & SQLITE_OPEN_READONLY) &&
        !(flags & SQLITE_OPEN_READWRITE) &&
        !(flags & SQLITE_OPEN_CREATE) &&
        !(flags & SQLITE_OPEN_DELETEONCLOSE)) {
        mode |= QIODeviceBase::OpenModeFlag::ReadOnly;
    } else {
        /*
            ** ^The [SQLITE_OPEN_EXCLUSIVE] flag is always used in conjunction
            ** with the [SQLITE_OPEN_CREATE] flag, which are both directly
            ** analogous to the O_EXCL and O_CREAT flags of the POSIX open()
            ** API.  The SQLITE_OPEN_EXCLUSIVE flag, when paired with the
            ** SQLITE_OPEN_CREATE, is used to indicate that file should always
            ** be created, and that it is an error if it already exists.
            ** It is <i>not</i> used to indicate the file should be opened
            ** for exclusive access.
         */
        if ((flags & SQLITE_OPEN_CREATE) && (flags & SQLITE_OPEN_EXCLUSIVE))
            mode |= QIODeviceBase::OpenModeFlag::NewOnly;

        if (flags & SQLITE_OPEN_READWRITE)
            mode |= QIODeviceBase::OpenModeFlag::ReadWrite;
    }

    file->pMethods = &vfs->ioMethods;
    file->pFile = new File::QtFile(QString::fromUtf8(zName), bool(flags & SQLITE_OPEN_DELETEONCLOSE));
    if (!file->pFile->open(mode))
        return SQLITE_CANTOPEN;
    if (pOutFlags)
        *pOutFlags = flags;

    return SQLITE_OK;
}